

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

void Abc_CexPrintStatsInputs(Abc_Cex_t *p,int nInputs)

{
  int iVar1;
  int local_28;
  int local_24;
  int Counter2;
  int Counter;
  int k;
  int nInputs_local;
  Abc_Cex_t *p_local;
  
  local_24 = 0;
  local_28 = 0;
  if (p == (Abc_Cex_t *)0x0) {
    printf("The counter example is NULL.\n");
  }
  else if (p == (Abc_Cex_t *)0x1) {
    printf("The counter example is present but not available (pointer has value \"1\").\n");
  }
  else {
    for (Counter2 = 0; Counter2 < p->nBits; Counter2 = Counter2 + 1) {
      iVar1 = Abc_InfoHasBit((uint *)(p + 1),Counter2);
      local_24 = iVar1 + local_24;
      if ((Counter2 - p->nRegs) % p->nPis < nInputs) {
        iVar1 = Abc_InfoHasBit((uint *)(p + 1),Counter2);
        local_28 = iVar1 + local_28;
      }
    }
    printf("CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%) 1sIn =%8d (%5.2f %%)\n"
           ,((double)local_24 * 100.0) / (double)(p->nBits - p->nRegs),
           ((double)local_28 * 100.0) /
           (double)((p->nBits - p->nRegs) - (p->iFrame + 1) * (p->nPis - nInputs)),
           (ulong)(uint)p->iPo,(ulong)(uint)p->iFrame,(ulong)(uint)p->nRegs,(ulong)(uint)p->nPis,
           (ulong)(uint)p->nBits,local_24,local_28);
  }
  return;
}

Assistant:

void Abc_CexPrintStatsInputs( Abc_Cex_t * p, int nInputs )
{
    int k, Counter = 0, Counter2 = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    for ( k = 0; k < p->nBits; k++ )
    {
        Counter += Abc_InfoHasBit(p->pData, k);
        if ( (k - p->nRegs) % p->nPis < nInputs )
            Counter2 += Abc_InfoHasBit(p->pData, k);
    }
    printf( "CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%) 1sIn =%8d (%5.2f %%)\n", 
        p->iPo, p->iFrame, p->nRegs, p->nPis, p->nBits, 
        Counter,  100.0 * Counter  / (p->nBits - p->nRegs), 
        Counter2, 100.0 * Counter2 / (p->nBits - p->nRegs - (p->iFrame + 1) * (p->nPis - nInputs)) );
}